

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O0

void genpub(uint8_t *pub,uint8_t *sec)

{
  sc_t a;
  ed A;
  uint8_t h [64];
  size_t in_stack_ffffffffffffff50;
  ed *in_stack_ffffffffffffff58;
  limb_t *in_stack_ffffffffffffff60;
  uint8_t *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  
  ed25519_key_setup(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sc_import(in_stack_ffffffffffffff60,(uint8_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
           );
  ed_scale_base((ed *)h._32_8_,(limb_t *)h._24_8_);
  ed_export((uint8_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

static void
genpub(uint8_t pub[ED25519_KEY_LEN], const uint8_t sec[ED25519_KEY_LEN])
{
	uint8_t h[SHA512_HASH_LENGTH];
	struct ed A;
	sc_t a;

	/* derive secret and import it */
	ed25519_key_setup(h, sec);
	sc_import(a, h, 32);

	/* multiply with base point to calculate public key */
	ed_scale_base(&A, a);
	ed_export(pub, &A);
}